

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void __thiscall wabt::anon_unknown_0::CWriter::DeclareStruct(CWriter *this,TypeVector *types)

{
  pointer pTVar1;
  Type type;
  byte bVar2;
  uint uVar3;
  TypeVector *in_RDX;
  OpenBrace *u;
  _Alloc_hider t;
  ulong uVar4;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar5;
  string name;
  
  (anonymous_namespace)::CWriter::MangleTypes_abi_cxx11_(&name,(CWriter *)types,in_RDX);
  pVar5 = std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&this->typevector_structs_,&name);
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    Write(this);
    WriteData(this,"#ifndef ",8);
    WriteData(this,name._M_dataplus._M_p,name._M_string_length);
    Write(this);
    WriteData(this,"#define ",8);
    WriteData(this,name._M_dataplus._M_p,name._M_string_length);
    WriteData(this," ",1);
    WriteData(this,name._M_dataplus._M_p,name._M_string_length);
    Write(this);
    WriteData(this,"struct ",7);
    t = name._M_dataplus;
    WriteData(this,name._M_dataplus._M_p,name._M_string_length);
    (anonymous_namespace)::CWriter::Write<char_const(&)[2],wabt::(anonymous_namespace)::OpenBrace>
              ((CWriter *)this,(char (*) [2])t._M_p,u);
    uVar3 = 0;
    while( true ) {
      uVar4 = (ulong)uVar3;
      pTVar1 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl
                        .super__Vector_impl_data._M_finish - (long)pTVar1 >> 3) <= uVar4) break;
      type = pTVar1[uVar4];
      Write(this,type);
      bVar2 = MangleType(type);
      Writef(this," %c%d;",(ulong)bVar2,uVar4);
      Write(this);
      uVar3 = uVar3 + 1;
    }
    Write(this);
    WriteData(this,";",1);
    Write(this);
    WriteData(this,"#endif  /* ",0xb);
    WriteData(this,name._M_dataplus._M_p,name._M_string_length);
    WriteData(this," */",3);
    Write(this);
  }
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void CWriter::DeclareStruct(const TypeVector& types) {
  const std::string name = MangleTypes(types);
  if (!typevector_structs_.insert(name).second) {
    return;
  }

  Write(Newline(), "#ifndef ", name, Newline());
  Write("#define ", name, " ", name, Newline());
  Write("struct ", name, " ", OpenBrace());
  for (Index i = 0; i < types.size(); ++i) {
    const Type type = types[i];
    Write(type);
    Writef(" %c%d;", MangleType(type), i);
    Write(Newline());
  }
  Write(CloseBrace(), ";", Newline(), "#endif  /* ", name, " */", Newline());
}